

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsInputSetDefaultTime(HelicsInput inp,HelicsTime val,HelicsError *err)

{
  InputObject *pIVar1;
  long local_8;
  
  pIVar1 = anon_unknown.dwarf_7c49a::verifyInput(inp,err);
  if (pIVar1 != (InputObject *)0x0) {
    local_8 = 0x7fffffffffffffff;
    if (val <= -9223372036.854765) {
      local_8 = -0x7fffffffffffffff;
    }
    else if (val < 9223372036.854765) {
      local_8 = (long)(val * 1000000000.0 +
                      *(double *)(&DAT_00429020 + (ulong)(0.0 <= val * 1000000000.0) * 8));
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&pIVar1->inputPtr->lastValue,&local_8);
  }
  return;
}

Assistant:

void helicsInputSetDefaultTime(HelicsInput inp, HelicsTime val, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }

    const helics::Time tval(val);
    inpObj->inputPtr->setDefault(tval);
}